

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IRContext::KillInstructionIf
          (IRContext *this,inst_iterator *begin,inst_iterator *end,
          function<bool_(spvtools::opt::Instruction_*)> *condition)

{
  Instruction *pIVar1;
  bool bVar2;
  bool bVar3;
  Instruction *__args;
  
  bVar3 = false;
  pIVar1 = (begin->super_iterator).node_;
  while (__args = pIVar1, __args != (end->super_iterator).node_) {
    bVar2 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()(condition,__args);
    pIVar1 = (__args->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (bVar2) {
      KillInst(this,__args);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool IRContext::KillInstructionIf(Module::inst_iterator begin,
                                  Module::inst_iterator end,
                                  std::function<bool(Instruction*)> condition) {
  bool removed = false;
  for (auto it = begin; it != end;) {
    if (!condition(&*it)) {
      ++it;
      continue;
    }

    removed = true;
    // `it` is an iterator on an intrusive list. Next is invalidated on the
    // current node when an instruction is killed. The iterator must be moved
    // forward before deleting the node.
    auto instruction = &*it;
    ++it;
    KillInst(instruction);
  }

  return removed;
}